

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

KeyInfo * keyInfoFromExprList(Parse *pParse,ExprList *pList)

{
  uint uVar1;
  sqlite3 *db;
  KeyInfo *pKVar2;
  CollSeq *pCVar3;
  ulong uVar4;
  ExprList_item *pEVar5;
  ulong uVar6;
  
  db = pParse->db;
  uVar1 = pList->nExpr;
  pKVar2 = (KeyInfo *)sqlite3DbMallocZero(db,uVar1 * 9 + 0x20);
  if (pKVar2 != (KeyInfo *)0x0) {
    pKVar2->aSortOrder = (u8 *)(pKVar2->aColl + (int)uVar1);
    pKVar2->nField = (u16)uVar1;
    pKVar2->enc = db->aDb->pSchema->enc;
    pKVar2->db = db;
    pEVar5 = pList->a;
    uVar6 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      pCVar3 = sqlite3ExprCollSeq(pParse,pEVar5->pExpr);
      if (pCVar3 == (CollSeq *)0x0) {
        pCVar3 = db->pDfltColl;
      }
      pKVar2->aColl[uVar6] = pCVar3;
      pKVar2->aSortOrder[uVar6] = pEVar5->sortOrder;
      pEVar5 = pEVar5 + 1;
    }
  }
  return pKVar2;
}

Assistant:

static KeyInfo *keyInfoFromExprList(Parse *pParse, ExprList *pList){
  sqlite3 *db = pParse->db;
  int nExpr;
  KeyInfo *pInfo;
  struct ExprList_item *pItem;
  int i;

  nExpr = pList->nExpr;
  pInfo = sqlite3DbMallocZero(db, sizeof(*pInfo) + nExpr*(sizeof(CollSeq*)+1) );
  if( pInfo ){
    pInfo->aSortOrder = (u8*)&pInfo->aColl[nExpr];
    pInfo->nField = (u16)nExpr;
    pInfo->enc = ENC(db);
    pInfo->db = db;
    for(i=0, pItem=pList->a; i<nExpr; i++, pItem++){
      CollSeq *pColl;
      pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      if( !pColl ){
        pColl = db->pDfltColl;
      }
      pInfo->aColl[i] = pColl;
      pInfo->aSortOrder[i] = pItem->sortOrder;
    }
  }
  return pInfo;
}